

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkTopAnd(Abc_Ntk_t *pNtk)

{
  Abc_Aig_t *pMan;
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar6;
  int local_4c;
  int nNodes;
  int i;
  Abc_Obj_t *pObjPo;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkAig;
  Vec_Ptr_t *vOrder;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x29a,"Abc_Ntk_t *Abc_NtkTopAnd(Abc_Ntk_t *)");
  }
  pAVar3 = Abc_NtkPo(pNtk,0);
  pAVar3 = Abc_ObjChild0(pAVar3);
  p = Abc_NodeGetSuper(pAVar3);
  iVar1 = Vec_PtrSize(p);
  if (1 < iVar1) {
    Abc_NtkCleanCopy(pNtk);
    pNtk_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    pcVar4 = Extra_UtilStrsav(pNtk->pName);
    pNtk_local->pName = pcVar4;
    pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_local->pSpec = pcVar4;
    pAVar3 = Abc_AigConst1(pNtk_local);
    pAVar5 = Abc_AigConst1(pNtk);
    (pAVar5->field_6).pCopy = pAVar3;
    for (local_4c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
      pAVar3 = Abc_NtkPi(pNtk,local_4c);
      Abc_NtkDupObj(pNtk_local,pAVar3,1);
    }
    p_00 = Abc_NtkDfsIterNodes(pNtk,p);
    for (local_4c = 0; iVar1 = Vec_PtrSize(p_00), local_4c < iVar1; local_4c = local_4c + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p_00,local_4c);
      pMan = (Abc_Aig_t *)pNtk_local->pManFunc;
      pAVar5 = Abc_ObjChild0Copy(pAVar3);
      pAVar6 = Abc_ObjChild1Copy(pAVar3);
      pAVar5 = Abc_AigAnd(pMan,pAVar5,pAVar6);
      (pAVar3->field_6).pCopy = pAVar5;
    }
    Vec_PtrFree(p_00);
    for (local_4c = 0; iVar1 = Vec_PtrSize(p), local_4c < iVar1; local_4c = local_4c + 1) {
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p,local_4c);
      pAVar6 = Abc_NtkCreatePo(pNtk_local);
      pAVar3 = Abc_ObjRegular(pAVar5);
      pAVar3 = (pAVar3->field_6).pCopy;
      iVar1 = Abc_ObjIsComplement(pAVar5);
      pAVar3 = Abc_ObjNotCond(pAVar3,iVar1);
      Abc_ObjAddFanin(pAVar6,pAVar3);
      pcVar4 = Abc_ObjName(pAVar6);
      Abc_ObjAssignName(pAVar6,pcVar4,(char *)0x0);
    }
    Vec_PtrFree(p);
    uVar2 = Abc_AigCleanup((Abc_Aig_t *)pNtk_local->pManFunc);
    if (uVar2 != 0) {
      printf("Abc_NtkTopAnd(): AIG cleanup removed %d nodes (this is a bug).\n",(ulong)uVar2);
    }
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      printf("Abc_NtkStrash: The network check has failed.\n");
      Abc_NtkDelete(pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    return pNtk_local;
  }
  __assert_fail("Vec_PtrSize(vNodes) >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                ,0x29e,"Abc_Ntk_t *Abc_NtkTopAnd(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkTopAnd( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes, * vOrder;
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj, * pDriver, * pObjPo;
    int i, nNodes;
    assert( Abc_NtkIsStrash(pNtk) );
    // get the first PO
    pObjPo = Abc_NtkPo(pNtk, 0);
    vNodes = Abc_NodeGetSuper( Abc_ObjChild0(pObjPo) );
    assert( Vec_PtrSize(vNodes) >= 2 );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    Abc_NtkCleanCopy( pNtk );
    pNtkAig = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkAig);
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkAig, pObj, 1 );
    // restrash the nodes reachable from the roots
    vOrder = Abc_NtkDfsIterNodes( pNtk, vNodes );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    Vec_PtrFree( vOrder );
    // finalize the network
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObjPo = Abc_NtkCreatePo(pNtkAig);
        pDriver = Abc_ObjNotCond(Abc_ObjRegular(pObj)->pCopy, Abc_ObjIsComplement(pObj));
        Abc_ObjAddFanin( pObjPo, pDriver );
        Abc_ObjAssignName( pObjPo, Abc_ObjName(pObjPo), NULL );
    }
    Vec_PtrFree( vNodes );
    // perform cleanup if requested
    if ( (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) ) 
        printf( "Abc_NtkTopAnd(): AIG cleanup removed %d nodes (this is a bug).\n", nNodes );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}